

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::SmallVector
          (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> *this,
          size_type capacity)

{
  (this->super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>).data_ =
       (pointer)(this->super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>
                ).firstElement;
  (this->super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>).len = 0;
  (this->super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>).cap = 8;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::reserve
            (&this->super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }